

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_plain_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  ID *__k;
  uint uVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool is_noperspective;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  BuiltIn builtin;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t location;
  uint32_t component;
  uint32_t uVar11;
  SPIRType *pSVar12;
  SPIRFunction *this_00;
  SPIREntryPoint *pSVar13;
  size_type sVar14;
  mapped_type *pmVar15;
  undefined8 *puVar16;
  Bitset *pBVar17;
  size_type sVar18;
  mapped_type *pmVar19;
  CompilerMSL *this_01;
  byte local_26c;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_228;
  string *local_220;
  SPIRType *local_218;
  string qual_var_name;
  string local_1f0;
  string mbr_name;
  _Any_data local_1b0;
  undefined1 local_1a0 [8];
  code *local_198;
  undefined1 local_190 [16];
  uint local_180;
  undefined4 uStack_17c;
  string local_50;
  
  bVar4 = Compiler::is_builtin_variable((Compiler *)this,var);
  builtin = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  bVar5 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationFlat);
  is_noperspective =
       Compiler::has_decoration
                 ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationNoPerspective);
  bVar6 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationCentroid);
  bVar7 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationSample);
  uVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          buffer_size;
  uVar9 = ensure_correct_builtin_type(this,*(uint32_t *)&(var->super_IVariant).field_0xc,builtin);
  *(uint32_t *)&(var->super_IVariant).field_0xc = uVar9;
  uVar9 = Compiler::get_pointee_type_id((Compiler *)this,uVar9);
  if (meta->strip_array == true) {
    pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
    bVar8 = Compiler::is_array((Compiler *)this,pSVar12);
    if (bVar8) {
      pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
      uVar9 = (pSVar12->parent_type).id;
    }
  }
  pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
  uVar1 = pSVar12->vecsize;
  this_00 = Compiler::get<spirv_cross::SPIRFunction>
                      ((Compiler *)this,
                       (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_218 = pSVar12;
  bVar8 = add_component_variable_to_interface_block(this,storage,ib_var_ref,var,pSVar12,meta);
  if (bVar8) {
    return;
  }
  __k = &(var->super_IVariant).self;
  local_228 = &ib_type->member_types;
  bVar8 = Compiler::has_decoration((Compiler *)this,(ID)__k->id,DecorationLocation);
  if ((((bVar8) && ((this->msl_options).pad_fragment_output_components == true)) &&
      (pSVar13 = Compiler::get_entry_point((Compiler *)this), storage == StorageClassOutput)) &&
     (pSVar13->model == ExecutionModelFragment)) {
    uVar10 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationLocation);
    uVar10 = get_target_components_for_fragment_location(this,uVar10);
    bVar8 = uVar1 < uVar10;
    if (bVar8) {
      uVar9 = build_extended_vector_type(this,uVar9,uVar10,Unknown);
    }
LAB_001a4bae:
    local_26c = 0;
LAB_001a4bc6:
    local_1b0._0_4_ = uVar9;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              (local_228,(TypedID<(spirv_cross::Types)1> *)&local_1b0);
  }
  else {
    if (storage != StorageClassInput) {
      bVar8 = false;
      goto LAB_001a4bae;
    }
    local_1b0._0_4_ = __k->id;
    sVar14 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1b0._M_pod_data);
    if (sVar14 == 0) {
      bVar8 = false;
      local_26c = 1;
      goto LAB_001a4bc6;
    }
    uVar10 = build_msl_interpolant_type(this,uVar9,is_noperspective);
    local_1b0._0_4_ = uVar10;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              (local_228,(TypedID<(spirv_cross::Types)1> *)&local_1b0);
    local_26c = 1;
    bVar8 = false;
  }
  local_220 = &local_50;
  CompilerGLSL::to_expression_abi_cxx11_(local_220,&this->super_CompilerGLSL,__k->id,true);
  this_01 = (CompilerMSL *)0x2bf319;
  ::std::__cxx11::string::string((string *)&local_1f0,"m",(allocator *)local_1b0._M_pod_data);
  ensure_valid_name(&mbr_name,this_01,&local_50,&local_1f0);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  ::std::__cxx11::string::~string((string *)&local_50);
  local_220 = &mbr_name;
  uVar10 = (uint32_t)uVar2;
  Compiler::set_member_name
            ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,local_220);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   ib_var_ref,".");
  ::std::operator+(&qual_var_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   &mbr_name);
  ::std::__cxx11::string::~string((string *)local_1b0._M_pod_data);
  if (local_26c != 0) {
    local_1b0._0_4_ = __k->id;
    sVar14 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1b0._M_pod_data);
    if (sVar14 != 0) {
      if (bVar7 && !bVar6) {
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&local_248,&this->super_CompilerGLSL,this->builtin_sample_id_id,true);
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&local_1b0,(spirv_cross *)".interpolate_at_sample(",
                   (char (*) [24])&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,
                   (char (*) [2])pSVar12);
        ::std::__cxx11::string::append((string *)&qual_var_name);
        ::std::__cxx11::string::~string((string *)local_1b0._M_pod_data);
        ::std::__cxx11::string::~string((string *)local_248._M_pod_data);
      }
      else {
        ::std::__cxx11::string::append((char *)&qual_var_name);
      }
    }
  }
  if (bVar8) {
    SPIRFunction::add_local_variable(this_00,(VariableID)(var->super_IVariant).self.id);
    local_1b0._0_4_ = (var->super_IVariant).self.id;
    SmallVector<unsigned_int,_8UL>::push_back
              (&this->vars_needing_early_declaration,(uint *)local_1b0._M_pod_data);
    local_1b0._M_unused._M_object = var;
    local_1b0._8_8_ = this;
    ::std::__cxx11::string::string((string *)local_1a0,(string *)&qual_var_name);
    uStack_17c = 0;
    local_248._M_unused._M_object = (void *)0x0;
    local_248._8_8_ = 0;
    local_238 = (code *)0x0;
    pcStack_230 = (code *)0x0;
    local_180 = uVar1;
    local_248._M_unused._M_object = operator_new(0x38);
    *(void **)local_248._M_unused._0_8_ = local_1b0._M_unused._M_object;
    *(undefined8 *)((long)local_248._M_unused._0_8_ + 8) = local_1b0._8_8_;
    *(code **)((long)local_248._M_unused._0_8_ + 0x10) =
         (code *)((long)local_248._M_unused._0_8_ + 0x20);
    if (local_1a0 == (undefined1  [8])local_190) {
      *(ulong *)((long)local_248._M_unused._0_8_ + 0x20) = CONCAT71(local_190._1_7_,local_190[0]);
      *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x28) = local_190._8_8_;
    }
    else {
      *(undefined1 (*) [8])((long)local_248._M_unused._0_8_ + 0x10) = local_1a0;
      *(ulong *)((long)local_248._M_unused._0_8_ + 0x20) = CONCAT71(local_190._1_7_,local_190[0]);
    }
    *(code **)((long)local_248._M_unused._0_8_ + 0x18) = local_198;
    local_198 = (code *)0x0;
    local_190[0] = (code)0x0;
    *(ulong *)((long)local_248._M_unused._0_8_ + 0x30) = CONCAT44(uStack_17c,local_180);
    pcStack_230 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2623:41)>
                  ::_M_invoke;
    local_238 = ::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2623:41)>
                ::_M_manager;
    local_1a0 = (undefined1  [8])local_190;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&this_00->fixup_hooks_out,(function<void_()> *)&local_248);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_248);
    ::std::__cxx11::string::~string((string *)local_1a0);
  }
  else if (meta->strip_array == false) {
    pmVar15 = ::std::__detail::
              _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
    ::std::__cxx11::string::_M_assign((string *)&(pmVar15->decoration).qualified_alias);
  }
  if ((var->storage == StorageClassOutput) && ((var->initializer).id != 0)) {
    if (bVar8) {
      local_198 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2644:8)>
                  ::_M_invoke;
      local_1a0 = (undefined1  [8])
                  ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2644:8)>
                  ::_M_manager;
      local_1b0._M_unused._M_object = var;
      local_1b0._8_8_ = this;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&this_00->fixup_hooks_in,(function<void_()> *)&local_1b0);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_1b0);
    }
    else if (meta->strip_array == true) {
      local_1b0._M_unused._M_object = var;
      local_1b0._8_8_ = this;
      SPIRType::SPIRType((SPIRType *)local_1a0,ib_type);
      local_238 = (code *)0x0;
      pcStack_230 = (code *)0x0;
      local_248._M_unused._M_object = (void *)0x0;
      local_248._8_8_ = 0;
      puVar16 = (undefined8 *)operator_new(0x160);
      *puVar16 = local_1b0._M_unused._M_object;
      puVar16[1] = local_1b0._8_8_;
      SPIRType::SPIRType((SPIRType *)(puVar16 + 2),(SPIRType *)local_1a0);
      pcStack_230 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2650:41)>
                    ::_M_invoke;
      local_238 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2650:41)>
                  ::_M_manager;
      local_248._M_unused._M_object = puVar16;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&this_00->fixup_hooks_in,(function<void_()> *)&local_248);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_248);
      SPIRType::~SPIRType((SPIRType *)local_1a0);
    }
    else {
      local_1b0._M_unused._M_object = var;
      local_1b0._8_8_ = this;
      ::std::__cxx11::string::string((string *)local_1a0,(string *)&qual_var_name);
      local_238 = (code *)0x0;
      pcStack_230 = (code *)0x0;
      local_248._M_unused._M_object = (void *)0x0;
      local_248._8_8_ = 0;
      local_248._M_unused._M_object = operator_new(0x30);
      pcVar3 = local_198;
      *(void **)local_248._M_unused._0_8_ = local_1b0._M_unused._M_object;
      *(undefined8 *)((long)local_248._M_unused._0_8_ + 8) = local_1b0._8_8_;
      *(code **)((long)local_248._M_unused._0_8_ + 0x10) =
           (code *)((long)local_248._M_unused._0_8_ + 0x20);
      if (local_1a0 == (undefined1  [8])local_190) {
        *(ulong *)((long)local_248._M_unused._0_8_ + 0x20) = CONCAT71(local_190._1_7_,local_190[0]);
        *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x28) = local_190._8_8_;
      }
      else {
        *(undefined1 (*) [8])((long)local_248._M_unused._0_8_ + 0x10) = local_1a0;
        *(ulong *)((long)local_248._M_unused._0_8_ + 0x20) = CONCAT71(local_190._1_7_,local_190[0]);
      }
      local_198 = (code *)0x0;
      *(code **)((long)local_248._M_unused._0_8_ + 0x18) = pcVar3;
      local_190[0] = (code)0x0;
      pcStack_230 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2661:41)>
                    ::_M_invoke;
      local_238 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2661:41)>
                  ::_M_manager;
      local_1a0 = (undefined1  [8])local_190;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&this_00->fixup_hooks_in,(function<void_()> *)&local_248);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_248);
      ::std::__cxx11::string::~string((string *)local_1a0);
    }
  }
  pBVar17 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
  if ((pBVar17->lower & 0x40000000) == 0) {
    if (bVar4) {
      bVar8 = Compiler::is_tessellation_shader((Compiler *)this);
      if ((local_26c & bVar8) != 0) {
        local_1b0._0_4_ = builtin;
        sVar18 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(&(this->inputs_by_builtin)._M_h,(key_type_conflict *)local_1b0._M_pod_data)
        ;
        if (sVar18 != 0) {
          pmVar19 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->inputs_by_builtin,(key_type *)local_1b0._M_pod_data);
          uVar9 = pmVar19->location;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                     DecorationLocation,uVar9);
          mark_location_as_used_by_shader(this,uVar9,local_218,StorageClassInput,false);
          goto LAB_001a528b;
        }
      }
      if ((storage == StorageClassOutput) && (this->capture_output_to_buffer != false)) {
        local_1b0._0_4_ = builtin;
        sVar18 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(&(this->outputs_by_builtin)._M_h,(key_type_conflict *)local_1b0._M_pod_data
                        );
        if (sVar18 != 0) {
          pmVar19 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->outputs_by_builtin,(key_type *)local_1b0._M_pod_data);
          uVar9 = pmVar19->location;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                     DecorationLocation,uVar9);
          mark_location_as_used_by_shader(this,uVar9,local_218,StorageClassOutput,false);
        }
      }
    }
  }
  else {
    location = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationLocation);
    component = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationComponent);
    if (local_26c != 0) {
      uVar9 = ensure_correct_input_type
                        (this,*(uint32_t *)&(var->super_IVariant).field_0xc,location,component,0,
                         meta->strip_array);
      *(uint32_t *)&(var->super_IVariant).field_0xc = uVar9;
      uVar9 = Compiler::get_pointee_type_id((Compiler *)this,uVar9);
      if (meta->strip_array == true) {
        pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
        bVar8 = Compiler::is_array((Compiler *)this,pSVar12);
        if (bVar8) {
          pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
          uVar9 = (pSVar12->parent_type).id;
        }
      }
      local_1b0._0_4_ = __k->id;
      sVar14 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1b0._M_pod_data);
      uVar11 = uVar9;
      if (sVar14 != 0) {
        uVar11 = build_msl_interpolant_type(this,uVar9,is_noperspective);
      }
      (local_228->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr
      [uVar2 & 0xffffffff].id = uVar11;
    }
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationLocation,
               location);
    if (component != 0) {
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
                 DecorationComponent,component);
    }
    pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar9);
    mark_location_as_used_by_shader(this,location,pSVar12,storage,false);
  }
LAB_001a528b:
  pBVar17 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
  if ((pBVar17->lower & 0x80000000) != 0) {
    uVar9 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationComponent);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationComponent
               ,uVar9);
  }
  pBVar17 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
  if ((pBVar17->lower & 0x100000000) != 0) {
    uVar9 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationIndex);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationIndex,
               uVar9);
  }
  if ((bVar4) &&
     (Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationBuiltIn
                 ,builtin), storage == StorageClassOutput && builtin == BuiltInPosition)) {
    ::std::__cxx11::string::_M_assign((string *)&this->qual_pos_var_name);
  }
  if (local_26c != 0) {
    local_1b0._0_4_ = __k->id;
    sVar14 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1b0._M_pod_data);
    if (sVar14 != 0) goto LAB_001a53f5;
  }
  if (bVar5) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationFlat,0);
  }
  if (is_noperspective) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,
               DecorationNoPerspective,0);
  }
  if (bVar6) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationCentroid,
               0);
  }
  if (bVar7) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar10,DecorationSample,0)
    ;
  }
LAB_001a53f5:
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,uVar10,
             SPIRVCrossDecorationInterfaceOrigID,__k->id);
  ::std::__cxx11::string::~string((string *)&qual_var_name);
  ::std::__cxx11::string::~string((string *)&mbr_name);
  return;
}

Assistant:

void CompilerMSL::add_plain_variable_to_interface_block(StorageClass storage, const string &ib_var_ref,
                                                        SPIRType &ib_type, SPIRVariable &var, InterfaceBlockMeta &meta)
{
	bool is_builtin = is_builtin_variable(var);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_flat = has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_decoration(var.self, DecorationCentroid);
	bool is_sample = has_decoration(var.self, DecorationSample);

	// Add a reference to the variable type to the interface struct.
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	uint32_t type_id = ensure_correct_builtin_type(var.basetype, builtin);
	var.basetype = type_id;

	type_id = get_pointee_type_id(var.basetype);
	if (meta.strip_array && is_array(get<SPIRType>(type_id)))
		type_id = get<SPIRType>(type_id).parent_type;
	auto &type = get<SPIRType>(type_id);
	uint32_t target_components = 0;
	uint32_t type_components = type.vecsize;

	bool padded_output = false;
	bool padded_input = false;
	uint32_t start_component = 0;

	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	if (add_component_variable_to_interface_block(storage, ib_var_ref, var, type, meta))
		return;

	bool pad_fragment_output = has_decoration(var.self, DecorationLocation) &&
	                           msl_options.pad_fragment_output_components &&
	                           get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput;

	if (pad_fragment_output)
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		target_components = get_target_components_for_fragment_location(locn);
		if (type_components < target_components)
		{
			// Make a new type here.
			type_id = build_extended_vector_type(type_id, target_components);
			padded_output = true;
		}
	}

	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(type_id, is_noperspective));
	else
		ib_type.member_types.push_back(type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(to_expression(var.self), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	if (padded_output || padded_input)
	{
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		if (padded_output)
		{
			entry_func.fixup_hooks_out.push_back([=, &var]() {
				statement(qual_var_name, vector_swizzle(type_components, start_component), " = ", to_name(var.self),
				          ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				statement(to_name(var.self), " = ", qual_var_name, vector_swizzle(type_components, start_component),
				          ";");
			});
		}
	}
	else if (!meta.strip_array)
		ir.meta[var.self].decoration.qualified_alias = qual_var_name;

	if (var.storage == StorageClassOutput && var.initializer != ID(0))
	{
		if (padded_output || padded_input)
		{
			entry_func.fixup_hooks_in.push_back(
			    [=, &var]() { statement(to_name(var.self), " = ", to_expression(var.initializer), ";"); });
		}
		else
		{
			if (meta.strip_array)
			{
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					uint32_t index = get_extended_decoration(var.self, SPIRVCrossDecorationInterfaceMemberIndex);
					auto invocation = to_tesc_invocation_id();
					statement(to_expression(stage_out_ptr_var_id), "[",
					          invocation, "].",
					          to_member_name(ib_type, index), " = ", to_expression(var.initializer), "[",
					          invocation, "];");
				});
			}
			else
			{
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					statement(qual_var_name, " = ", to_expression(var.initializer), ";");
				});
			}
		}
	}

	// Copy the variable location from the original variable to the member
	if (get_decoration_bitset(var.self).get(DecorationLocation))
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		uint32_t comp = get_decoration(var.self, DecorationComponent);
		if (storage == StorageClassInput)
		{
			type_id = ensure_correct_input_type(var.basetype, locn, comp, 0, meta.strip_array);
			var.basetype = type_id;

			type_id = get_pointee_type_id(type_id);
			if (meta.strip_array && is_array(get<SPIRType>(type_id)))
				type_id = get<SPIRType>(type_id).parent_type;
			if (pull_model_inputs.count(var.self))
				ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(type_id, is_noperspective);
			else
				ib_type.member_types[ib_mbr_idx] = type_id;
		}
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
		if (comp)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
		mark_location_as_used_by_shader(locn, get<SPIRType>(type_id), storage);
	}
	else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
	{
		uint32_t locn = inputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
		mark_location_as_used_by_shader(locn, type, storage);
	}
	else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
	{
		uint32_t locn = outputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
		mark_location_as_used_by_shader(locn, type, storage);
	}

	if (get_decoration_bitset(var.self).get(DecorationComponent))
	{
		uint32_t component = get_decoration(var.self, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, component);
	}

	if (get_decoration_bitset(var.self).get(DecorationIndex))
	{
		uint32_t index = get_decoration(var.self, DecorationIndex);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, index);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	// Copy interpolation decorations if needed
	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
}